

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap> * __thiscall
Memory::
AllocateArray<Memory::ArenaAllocator,Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,false>
          (Memory *this,ArenaAllocator *allocator,offset_in_ArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  void *__s;
  RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap> *pRVar1;
  
  if (count != 0) {
    __s = new__<Memory::ArenaAllocator>
                    (-(ulong)(count >> 0x3c != 0) | count << 4,(ArenaAllocator *)this,
                     (offset_in_ArenaAllocator_to_subr)allocator);
    pRVar1 = (RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap> *)
             memset(__s,0,count << 4);
    return pRVar1;
  }
  return (RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap> *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}